

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O0

void * __thiscall DataRefs::getVarAddr(DataRefs *this,dataRefsLT dr)

{
  LTError *this_00;
  int in_ESI;
  long in_RDI;
  void *local_8;
  
  switch(in_ESI) {
  case 0x1c:
    local_8 = (void *)(in_RDI + 0xc18);
    break;
  case 0x1d:
    local_8 = (void *)(in_RDI + 0xc1c);
    break;
  case 0x1e:
    local_8 = (void *)(in_RDI + 0xc40);
    break;
  case 0x1f:
    local_8 = (void *)(in_RDI + 0xc54);
    break;
  case 0x20:
    local_8 = (void *)(in_RDI + 0x638);
    break;
  case 0x21:
    local_8 = (void *)(in_RDI + 0x72c);
    break;
  case 0x22:
    local_8 = (void *)(in_RDI + 0x730);
    break;
  case 0x23:
    local_8 = (void *)(in_RDI + 0x734);
    break;
  case 0x24:
    local_8 = (void *)(in_RDI + 0x738);
    break;
  default:
    if ((in_ESI < 0x62) || (0x6e < in_ESI)) {
      this_00 = (LTError *)__cxa_allocate_exception(0x18);
      LTError::LTError(this_00,
                       "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/DataRefs.cpp"
                       ,0x2a9,"getVarAddr",logFATAL,"ASSERT FAILED: %s","NULL");
      __cxa_throw(this_00,&LTError::typeinfo,LTError::~LTError);
    }
    local_8 = (void *)(in_RDI + 0x6c8 + (long)(in_ESI + -0x62) * 4);
    break;
  case 0x26:
    local_8 = (void *)(in_RDI + 0x740);
    break;
  case 0x27:
    local_8 = (void *)(in_RDI + 0x744);
    break;
  case 0x28:
    local_8 = (void *)(in_RDI + 0x748);
    break;
  case 0x29:
    local_8 = (void *)(in_RDI + 0x74c);
    break;
  case 0x2a:
    local_8 = (void *)(in_RDI + 0x750);
    break;
  case 0x2b:
    local_8 = (void *)(in_RDI + 0x754);
    break;
  case 0x2c:
    local_8 = (void *)(in_RDI + 0x758);
    break;
  case 0x2d:
    local_8 = (void *)(in_RDI + 0x75c);
    break;
  case 0x2e:
    local_8 = (void *)(in_RDI + 0x62c);
    break;
  case 0x2f:
    local_8 = (void *)(in_RDI + 0x630);
    break;
  case 0x30:
    local_8 = (void *)(in_RDI + 0x634);
    break;
  case 0x31:
    local_8 = (void *)(in_RDI + 0x760);
    break;
  case 0x32:
    local_8 = (void *)(in_RDI + 0x764);
    break;
  case 0x33:
    local_8 = (void *)(in_RDI + 0x768);
    break;
  case 0x34:
    local_8 = (void *)(in_RDI + 0x76c);
    break;
  case 0x35:
    local_8 = (void *)(in_RDI + 0x770);
    break;
  case 0x36:
    local_8 = (void *)(in_RDI + 0x778);
    break;
  case 0x37:
    local_8 = (void *)(in_RDI + 0x77c);
    break;
  case 0x38:
    local_8 = (void *)(in_RDI + 0x780);
    break;
  case 0x39:
    local_8 = (void *)(in_RDI + 0x784);
    break;
  case 0x3a:
    local_8 = (void *)(in_RDI + 0x788);
    break;
  case 0x3b:
    local_8 = (void *)(in_RDI + 0x78c);
    break;
  case 0x3c:
    local_8 = (void *)(in_RDI + 0x790);
    break;
  case 0x3d:
    local_8 = (void *)(in_RDI + 0x794);
    break;
  case 0x3e:
    local_8 = (void *)(in_RDI + 0x798);
    break;
  case 0x3f:
    local_8 = (void *)(in_RDI + 0x79c);
    break;
  case 0x40:
    local_8 = (void *)(in_RDI + 0x7a0);
    break;
  case 0x41:
    local_8 = (void *)(in_RDI + 0x7a4);
    break;
  case 0x42:
    local_8 = (void *)(in_RDI + 0x7a8);
    break;
  case 0x43:
    local_8 = (void *)(in_RDI + 0x7ac);
    break;
  case 0x44:
    local_8 = (void *)(in_RDI + 0x7b0);
    break;
  case 0x45:
    local_8 = (void *)(in_RDI + 0x7b4);
    break;
  case 0x46:
    local_8 = (void *)(in_RDI + 0x7e0);
    break;
  case 0x47:
    local_8 = (void *)(in_RDI + 0x7e4);
    break;
  case 0x48:
    local_8 = (void *)(in_RDI + 0x7e8);
    break;
  case 0x49:
    local_8 = (void *)(in_RDI + 0x7b8);
    break;
  case 0x4a:
    local_8 = (void *)(in_RDI + 0x7bc);
    break;
  case 0x4b:
    local_8 = (void *)(in_RDI + 0x720);
    break;
  case 0x4c:
    local_8 = (void *)(in_RDI + 0x63c);
    break;
  case 0x4d:
    local_8 = (void *)(in_RDI + 0x640);
    break;
  case 0x4e:
    local_8 = (void *)(in_RDI + 0x644);
    break;
  case 0x4f:
    local_8 = (void *)(in_RDI + 0x648);
    break;
  case 0x50:
    local_8 = (void *)(in_RDI + 0x660);
    break;
  case 0x51:
    local_8 = (void *)(in_RDI + 0x650);
    break;
  case 0x52:
    local_8 = (void *)(in_RDI + 0x654);
    break;
  case 0x53:
    local_8 = (void *)(in_RDI + 0x65c);
    break;
  case 0x54:
    local_8 = (void *)(in_RDI + 0x64c);
    break;
  case 0x55:
    local_8 = (void *)(in_RDI + 0x7c0);
    break;
  case 0x56:
    local_8 = (void *)(in_RDI + 0x7c4);
    break;
  case 0x57:
    local_8 = (void *)(in_RDI + 0x7c8);
    break;
  case 0x58:
    local_8 = (void *)(in_RDI + 0x7cc);
    break;
  case 0x59:
    local_8 = (void *)(in_RDI + 2000);
    break;
  case 0x5a:
    local_8 = (void *)(in_RDI + 0x7d4);
    break;
  case 0x5b:
    local_8 = (void *)(in_RDI + 0x7d8);
    break;
  case 0x5c:
    local_8 = (void *)(in_RDI + 0x7dc);
    break;
  case 0x5d:
    local_8 = (void *)(in_RDI + 0x7ec);
    break;
  case 0x5e:
    local_8 = (void *)(in_RDI + 0x7f0);
    break;
  case 0x5f:
    local_8 = (void *)(in_RDI + 0x7f4);
    break;
  case 0x60:
    local_8 = (void *)(in_RDI + 0x7f8);
    break;
  case 0x61:
    local_8 = (void *)(in_RDI + 0x7fc);
  }
  return local_8;
}

Assistant:

void* DataRefs::getVarAddr (dataRefsLT dr)
{
    switch (dr) {
        // UI information
        case DR_UI_OPACITY:                 return &UIopacity;
        case DR_UI_FONT_SCALE:              return &UIFontScale;
        case DR_UI_SETTINGS_TRANSP:         return &SUItransp;
        case DR_UI_ACI_COLLAPSED:           return &ACIcollapsed;

        // configuration options
        case DR_CFG_AIRCRAFT_DISPLAYED:     return &bShowingAircraft;
        case DR_CFG_AUTO_START:             return &bAutoStart;
        case DR_CFG_MASTER_VOLUME:          return &volMaster;
        case DR_CFG_SND_FORCE_FMOD_INSTANCE:return &sndForceFmodInstance;
        case DR_CFG_AI_ON_REQUEST:          return &bAIonRequest;
        case DR_CFG_AI_NOT_ON_GND:          return &bAINotOnGnd;
        case DR_CFG_LABELS:                 return &labelCfg;
        case DR_CFG_LABEL_SHOWN:            return &labelShown;
        case DR_CFG_LABEL_MAX_DIST:         return &labelMaxDist;
        case DR_CFG_LABEL_VISIBILITY_CUT_OFF: return &bLabelVisibilityCUtOff;
        case DR_CFG_LABEL_FOR_PARKED:       return &bLabelForParked;
        case DR_CFG_LABEL_COL_DYN:          return &bLabelColDynamic;
        case DR_CFG_LABEL_COLOR:            return &labelColor;
        case DR_CFG_LOG_LEVEL:              return &iLogLevel;
        case DR_CFG_MSG_AREA_LEVEL:         return &iMsgAreaLevel;
        case DR_CFG_LOG_LIST_LEN:           return &logListLen;
        case DR_CFG_MAX_NUM_AC:             return &maxNumAc;
        case DR_CFG_FD_STD_DISTANCE:        return &fdStdDistance;
        case DR_CFG_FD_SNAP_TAXI_DIST:      return &fdSnapTaxiDist;
        case DR_CFG_FD_REFRESH_INTVL:       return &fdRefreshIntvl;
        case DR_CFG_FD_LONG_REFRESH_INTVL:  return &fdLongRefrIntvl;
        case DR_CFG_FD_BUF_PERIOD:          return &fdBufPeriod;
        case DR_CFG_FD_REDUCE_HEIGHT:       return &fdReduceHeight;
        case DR_CFG_MAX_NETW_TIMEOUT:       return &netwTimeoutMax;
        case DR_CFG_LND_LIGHTS_TAXI:        return &bLndLightsTaxi;
        case DR_CFG_HIDE_BELOW_AGL:         return &hideBelowAGL;
        case DR_CFG_HIDE_TAXIING:           return &hideTaxiing;
        case DR_CFG_HIDE_PARKING:           return &hideParking;
        case DR_CFG_HIDE_NEARBY_GND:        return &hideNearbyGnd;
        case DR_CFG_HIDE_NEARBY_AIR:        return &hideNearbyAir;
        case DR_CFG_HIDE_IN_REPLAY:         return &hideInReplay;
        case DR_CFG_HIDE_STATIC_TWR:        return &hideStaticTwr;
        case DR_CFG_COPY_OBJ_FILES:         return &cpyObjFiles;
        case DR_CFG_CONTRAIL_MIN_ALT:       return &contrailAltMin_ft;
        case DR_CFG_CONTRAIL_MAX_ALT:       return &contrailAltMax_ft;
        case DR_CFG_CONTRAIL_LIFE_TIME:     return &contrailLifeTime;
        case DR_CFG_CONTRAIL_MULTIPLE:      return &contrailMulti;
        case DR_CFG_WEATHER_CONTROL:        return &weatherCtl;
        case DR_CFG_WEATHER_MAX_METAR_AGL:  return &weatherMaxMETARheight_ft;
        case DR_CFG_WEATHER_MAX_METAR_DIST: return &weatherMaxMETARdist_nm;
        case DR_CFG_REMOTE_SUPPORT:         return &remoteSupport;
        case DR_CFG_EXTERNAL_CAMERA:        return &bUseExternalCamera;
        case DR_CFG_LAST_CHECK_NEW_VER:     return &lastCheckNewVer;

        // debug options
        case DR_DBG_AC_FILTER:              return &uDebugAcFilter;
        case DR_DBG_AC_POS:                 return &bDebugAcPos;
        case DR_DBG_LOG_RAW_FD:             return &bDebugLogRawFd;
        case DR_DBG_LOG_WEATHER:            return &bDebugWeather;
        case DR_DBG_MODEL_MATCHING:         return &bDebugModelMatching;
        case DR_DBG_EXPORT_FD:              return &bDebugExportFd;
        case DR_DBG_EXPORT_USER_AC:         return &bDebugExportUserAc;
        case DR_DBG_EXPORT_NORMALIZE_TS:    return &bDebugExportNormTS;
        case DR_DBG_EXPORT_FORMAT:          return &eDebugExportFdFormat;

        // channel configuration options
        case DR_CFG_FSC_ENV:                return &fscEnv;
        case DR_CFG_OGN_USE_REQUREPL:       return &ognUseRequRepl;
        case DR_CFG_RT_LISTEN_PORT:         return &rtListenPort;
        case DR_CFG_RT_TRAFFIC_PORT:        return &rtTrafficPort;
        case DR_CFG_RT_WEATHER_PORT:        return &rtWeatherPort;
        case DR_CFG_RT_SIM_TIME_CTRL:       return &rtSTC;
        case DR_CFG_RT_MAN_TOFFSET:         return &rtManTOfs;
        case DR_CFG_RT_CONNECT_TYPE:        return &rtConnType;
        case DR_CFG_FF_LISTEN_PORT:         return &ffListenPort;
        case DR_CFG_FF_SEND_PORT:           return &ffSendPort;
        case DR_CFG_FF_SEND_USER_PLANE:     return &bffUserPlane;
        case DR_CFG_FF_SEND_TRAFFIC:        return &bffTraffic;
        case DR_CFG_FF_SEND_TRAFFIC_INTVL:  return &ffSendTrfcIntvl;

        default:
            // flight channels
            if (DR_CHANNEL_FIRST <= dr && dr <= DR_CHANNEL_LAST)
                return &bChannel[dr-DR_CHANNEL_FIRST];
            
            // else: must not happen
            LOG_ASSERT(NULL);
            return NULL;
    }
}